

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

opj_t1_t * t1_create_v2(void)

{
  opj_mqc_t *poVar1;
  opj_raw_t *poVar2;
  opj_t1_t *l_t1;
  opj_t1_t *local_8;
  
  local_8 = (opj_t1_t *)malloc(0x40);
  if (local_8 == (opj_t1_t *)0x0) {
    local_8 = (opj_t1_t *)0x0;
  }
  else {
    memset(local_8,0,0x40);
    poVar1 = mqc_create();
    local_8->mqc = poVar1;
    if (local_8->mqc == (opj_mqc_t *)0x0) {
      t1_destroy((opj_t1_t *)0x1622a7);
      local_8 = (opj_t1_t *)0x0;
    }
    else {
      poVar2 = raw_create();
      local_8->raw = poVar2;
      if (local_8->raw == (opj_raw_t *)0x0) {
        t1_destroy((opj_t1_t *)0x1622d9);
        local_8 = (opj_t1_t *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

opj_t1_t* t1_create_v2()
{
	opj_t1_t *l_t1 = 00;

	l_t1 = (opj_t1_t*) opj_malloc(sizeof(opj_t1_t));
	if
		(!l_t1)
	{
		return 00;
	}
	memset(l_t1,0,sizeof(opj_t1_t));

	/* create MQC and RAW handles */
	l_t1->mqc = mqc_create();
	if
		(! l_t1->mqc)
	{
		t1_destroy(l_t1);
		return 00;
	}
	l_t1->raw = raw_create();
	if
		(! l_t1->raw)
	{
		t1_destroy(l_t1);
		return 00;
	}
	return l_t1;
}